

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

void mp::
     WriteFlatCon<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::CustomFunctionalConstraint<std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
               *c,ItemNamer *vnam)

{
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicWriter<char> *this;
  char *in_RDX;
  ItemNamer *in_RSI;
  CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
  *in_RDI;
  BasicMemoryWriter<char,_std::allocator<char>_> *unaff_retaddr;
  BasicStringRef<char> *in_stack_ffffffffffffffc0;
  BasicWriter<char> *in_stack_ffffffffffffffe0;
  CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::EquivalenceId>
  *cfc;
  
  cfc = in_RDI;
  BasicConstraint::name((BasicConstraint *)0x223b16);
  fmt::BasicStringRef<char>::BasicStringRef(in_stack_ffffffffffffffc0,(char *)in_RDI);
  value.size_ = (size_t)in_RSI;
  value.data_ = in_RDX;
  this = fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffe0,value);
  fmt::BasicStringRef<char>::BasicStringRef((BasicStringRef<char> *)this,(char *)in_RDI);
  value_00.size_ = (size_t)in_RSI;
  value_00.data_ = in_RDX;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffe0,value_00);
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,2ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::EquivalenceId>
            (unaff_retaddr,cfc,in_RSI);
  return;
}

Assistant:

inline void WriteFlatCon(Writer& wrt, const Con& c,
                  ItemNamer& vnam) {
  wrt << c.name() << ": ";
  WriteModelItem(wrt, c, vnam);
}